

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

void duckdb_zstd::ZSTD_updateRep(U32 *rep,U32 offBase,U32 ll0)

{
  U32 UVar1;
  U32 UVar2;
  uint uVar3;
  
  if (offBase < 4) {
    uVar3 = (offBase + ll0) - 1;
    if (uVar3 == 0) {
      return;
    }
    if (uVar3 == 3) {
      UVar1 = *rep;
      UVar2 = UVar1 - 1;
    }
    else {
      UVar2 = rep[uVar3];
      UVar1 = *rep;
    }
    rep[2] = rep[(ulong)(uVar3 == 1) + 1];
    rep[1] = UVar1;
  }
  else {
    *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
    UVar2 = offBase - 3;
  }
  *rep = UVar2;
  return;
}

Assistant:

MEM_STATIC void
ZSTD_updateRep(U32 rep[ZSTD_REP_NUM], U32 const offBase, U32 const ll0)
{
    if (OFFBASE_IS_OFFSET(offBase)) {  /* full offset */
        rep[2] = rep[1];
        rep[1] = rep[0];
        rep[0] = OFFBASE_TO_OFFSET(offBase);
    } else {   /* repcode */
        U32 const repCode = OFFBASE_TO_REPCODE(offBase) - 1 + ll0;
        if (repCode > 0) {  /* note : if repCode==0, no change */
            U32 const currentOffset = (repCode==ZSTD_REP_NUM) ? (rep[0] - 1) : rep[repCode];
            rep[2] = (repCode >= 2) ? rep[1] : rep[2];
            rep[1] = rep[0];
            rep[0] = currentOffset;
        } else {   /* repCode == 0 */
            /* nothing to do */
        }
    }
}